

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall re2::DFA::StateEqual::operator()(StateEqual *this,State *a,State *b)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (a == b) {
    return true;
  }
  if (b != (State *)0x0 && a != (State *)0x0) {
    uVar3 = a->ninst_;
    if ((uVar3 == b->ninst_) && (a->flag_ == b->flag_)) {
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      do {
        if (uVar5 == uVar4) {
          return (long)(int)uVar3 <= (long)uVar4;
        }
        piVar1 = a->inst_ + uVar4;
        piVar2 = b->inst_ + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 == *piVar2);
    }
  }
  return false;
}

Assistant:

bool operator()(const State* a, const State* b) const {
      if (a == b)
        return true;
      if (a == NULL || b == NULL)
        return false;
      if (a->ninst_ != b->ninst_)
        return false;
      if (a->flag_ != b->flag_)
        return false;
      for (int i = 0; i < a->ninst_; i++)
        if (a->inst_[i] != b->inst_[i])
          return false;
      return true;  // they're equal
    }